

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O2

void __thiscall
glslang::TBuiltIns::addTabledBuiltins
          (TBuiltIns *this,int version,EProfile profile,SpvVersion *spvVersion)

{
  anon_class_24_3_9116b085 forEachFunction;
  EProfile local_60;
  int local_5c;
  span<const_glslang::(anonymous_namespace)::BuiltInFunction> local_58;
  anon_class_24_3_9116b085 local_48;
  
  local_48.version = &local_5c;
  local_48.profile = &local_60;
  local_58.data_ = (pointer)&(anonymous_namespace)::BaseFunctions;
  local_58.count_ = 0x4f;
  local_60 = profile;
  local_5c = version;
  local_48.spvVersion = spvVersion;
  addTabledBuiltins::anon_class_24_3_9116b085::operator()
            (&local_48,&(this->super_TBuiltInParseables).commonBuiltins,&local_58);
  local_58.data_ = (pointer)&(anonymous_namespace)::DerivativeFunctions;
  local_58.count_ = 3;
  addTabledBuiltins::anon_class_24_3_9116b085::operator()
            (&local_48,(this->super_TBuiltInParseables).stageBuiltins + 4,&local_58);
  if ((local_60 == EEsProfile && 0x13f < local_5c) || (0x1c1 < local_5c && local_60 != EEsProfile))
  {
    local_58.data_ = (pointer)&(anonymous_namespace)::DerivativeFunctions;
    local_58.count_ = 3;
    addTabledBuiltins::anon_class_24_3_9116b085::operator()
              (&local_48,(this->super_TBuiltInParseables).stageBuiltins + 5,&local_58);
  }
  return;
}

Assistant:

void TBuiltIns::addTabledBuiltins(int version, EProfile profile, const SpvVersion& spvVersion)
{
    const auto forEachFunction = [&](TString& decls, const span<const BuiltInFunction>& functions) {
        for (const auto& fn : functions) {
            if (ValidVersion(fn, version, profile, spvVersion))
                AddTabledBuiltin(decls, fn);
        }
    };

    forEachFunction(commonBuiltins, BaseFunctions);
    forEachFunction(stageBuiltins[EShLangFragment], DerivativeFunctions);

    if ((profile == EEsProfile && version >= 320) || (profile != EEsProfile && version >= 450))
        forEachFunction(stageBuiltins[EShLangCompute], DerivativeFunctions);
}